

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delta_byte_array_decoder.cpp
# Opt level: O3

void __thiscall duckdb::DeltaByteArrayDecoder::InitializePage(DeltaByteArrayDecoder *this)

{
  uint64_t *puVar1;
  unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *this_00;
  uint uVar2;
  int iVar3;
  ColumnReader *pCVar4;
  Allocator *allocator;
  data_ptr_t pdVar5;
  data_ptr_t pdVar6;
  _Head_base<0UL,_duckdb::Vector_*,_false> _Var7;
  type buffer;
  _Head_base<0UL,_duckdb::Vector_*,_false> _Var8;
  type pVVar9;
  ulong uVar10;
  runtime_error *this_01;
  void *__src;
  void *__dest;
  undefined1 (*pauVar11) [16];
  idx_t iVar12;
  undefined1 auVar13 [16];
  idx_t prefix_count;
  idx_t suffix_count;
  LogicalType local_60 [24];
  idx_t local_48;
  idx_t local_40;
  idx_t local_38;
  
  if (this->reader->column_schema->field_0x29 == -0x38) {
    buffer = shared_ptr<duckdb::ResizeableBuffer,_true>::operator*(&this->reader->block);
    pCVar4 = this->reader;
    allocator = pCVar4->reader->allocator;
    ReadDbpData(allocator,buffer,pCVar4->encoding_buffers,&local_40);
    ReadDbpData(allocator,buffer,pCVar4->encoding_buffers + 1,&local_38);
    if (local_40 == local_38) {
      if (local_40 == 0) {
        _Var8._M_head_impl = (Vector *)operator_new(0x68);
        duckdb::LogicalType::LogicalType(local_60,VARCHAR);
        duckdb::Vector::Vector(_Var8._M_head_impl,local_60,0);
        duckdb::LogicalType::~LogicalType(local_60);
        _Var7._M_head_impl =
             (this->byte_array_data).
             super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
             super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
             super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
             super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl;
        (this->byte_array_data).
        super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
        super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
        super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl = _Var8._M_head_impl;
        if (_Var7._M_head_impl != (Vector *)0x0) {
          std::default_delete<duckdb::Vector>::operator()
                    ((default_delete<duckdb::Vector> *)&this->byte_array_data,_Var7._M_head_impl);
        }
      }
      else {
        pdVar5 = pCVar4->encoding_buffers[0].super_ByteBuffer.ptr;
        pdVar6 = pCVar4->encoding_buffers[1].super_ByteBuffer.ptr;
        _Var8._M_head_impl = (Vector *)operator_new(0x68);
        duckdb::LogicalType::LogicalType(local_60,VARCHAR);
        duckdb::Vector::Vector(_Var8._M_head_impl,local_60,local_40);
        duckdb::LogicalType::~LogicalType(local_60);
        this_00 = &this->byte_array_data;
        _Var7._M_head_impl =
             (this->byte_array_data).
             super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
             super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
             super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
             super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl;
        (this->byte_array_data).
        super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
        super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
        super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl = _Var8._M_head_impl;
        if (_Var7._M_head_impl != (Vector *)0x0) {
          std::default_delete<duckdb::Vector>::operator()
                    ((default_delete<duckdb::Vector> *)this_00,_Var7._M_head_impl);
        }
        local_48 = local_40;
        this->byte_array_count = local_40;
        this->delta_offset = 0;
        pVVar9 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                           (this_00);
        pauVar11 = *(undefined1 (**) [16])(pVVar9 + 0x20);
        iVar12 = 0;
        do {
          uVar2 = *(uint *)(pdVar6 + iVar12 * 4);
          iVar3 = *(int *)(pdVar5 + iVar12 * 4);
          ByteBuffer::available(&buffer->super_ByteBuffer,(ulong)uVar2);
          pVVar9 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                             (this_00);
          auVar13 = duckdb::StringVector::EmptyString(pVVar9,(ulong)(iVar3 + uVar2));
          __dest = auVar13._8_8_;
          *pauVar11 = auVar13;
          if (auVar13._0_4_ < 0xd) {
            __dest = *pauVar11 + 4;
          }
          uVar2 = *(uint *)(pdVar5 + iVar12 * 4);
          if ((ulong)uVar2 == 0) {
            uVar10 = 0;
          }
          else {
            if ((iVar12 == 0) || (*(uint *)pauVar11[-1] < uVar2)) {
              this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error
                        (this_01,"DELTA_BYTE_ARRAY - prefix is out of range - corrupt file?");
              goto LAB_0032f744;
            }
            if (*(uint *)pauVar11[-1] < 0xd) {
              __src = pauVar11[-1] + 4;
            }
            else {
              __src = *(void **)(pauVar11[-1] + 8);
            }
            switchD_0033274c::default(__dest,__src,(ulong)uVar2);
            uVar10 = (ulong)*(uint *)(pdVar5 + iVar12 * 4);
          }
          switchD_0033274c::default
                    ((void *)((long)__dest + uVar10),(buffer->super_ByteBuffer).ptr,
                     (ulong)*(uint *)(pdVar6 + iVar12 * 4));
          uVar10 = (ulong)*(uint *)(pdVar6 + iVar12 * 4);
          ByteBuffer::available(&buffer->super_ByteBuffer,uVar10);
          puVar1 = &(buffer->super_ByteBuffer).len;
          *puVar1 = *puVar1 - uVar10;
          (buffer->super_ByteBuffer).ptr = (buffer->super_ByteBuffer).ptr + uVar10;
          uVar10 = (ulong)*(uint *)*pauVar11;
          if (uVar10 < 0xd) {
            memset(*pauVar11 + uVar10 + 4,0,0xc - uVar10);
          }
          else {
            *(undefined4 *)(*pauVar11 + 4) = **(undefined4 **)(*pauVar11 + 8);
          }
          iVar12 = iVar12 + 1;
          pauVar11 = pauVar11 + 1;
        } while (local_48 != iVar12);
      }
      return;
    }
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_01,"DELTA_BYTE_ARRAY - prefix and suffix counts are different - corrupt file?");
  }
  else {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_01,"Delta Byte Array encoding is only supported for string/blob data");
  }
LAB_0032f744:
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void DeltaByteArrayDecoder::InitializePage() {
	if (reader.Type().InternalType() != PhysicalType::VARCHAR) {
		throw std::runtime_error("Delta Byte Array encoding is only supported for string/blob data");
	}
	auto &block = *reader.block;
	auto &allocator = reader.reader.allocator;
	idx_t prefix_count, suffix_count;
	auto &prefix_buffer = reader.encoding_buffers[0];
	auto &suffix_buffer = reader.encoding_buffers[1];
	ReadDbpData(allocator, block, prefix_buffer, prefix_count);
	ReadDbpData(allocator, block, suffix_buffer, suffix_count);
	if (prefix_count != suffix_count) {
		throw std::runtime_error("DELTA_BYTE_ARRAY - prefix and suffix counts are different - corrupt file?");
	}
	if (prefix_count == 0) {
		// no values
		byte_array_data = make_uniq<Vector>(LogicalType::VARCHAR, nullptr);
		return;
	}
	auto prefix_data = reinterpret_cast<uint32_t *>(prefix_buffer.ptr);
	auto suffix_data = reinterpret_cast<uint32_t *>(suffix_buffer.ptr);
	byte_array_data = make_uniq<Vector>(LogicalType::VARCHAR, prefix_count);
	byte_array_count = prefix_count;
	delta_offset = 0;
	auto string_data = FlatVector::GetData<string_t>(*byte_array_data);
	for (idx_t i = 0; i < prefix_count; i++) {
		auto str_len = prefix_data[i] + suffix_data[i];
		block.available(suffix_data[i]);
		string_data[i] = StringVector::EmptyString(*byte_array_data, str_len);
		auto result_data = string_data[i].GetDataWriteable();
		if (prefix_data[i] > 0) {
			if (i == 0 || prefix_data[i] > string_data[i - 1].GetSize()) {
				throw std::runtime_error("DELTA_BYTE_ARRAY - prefix is out of range - corrupt file?");
			}
			memcpy(result_data, string_data[i - 1].GetData(), prefix_data[i]);
		}
		memcpy(result_data + prefix_data[i], block.ptr, suffix_data[i]);
		block.inc(suffix_data[i]);
		string_data[i].Finalize();
	}
}